

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O3

void js_std_free_handlers(JSRuntime *rt)

{
  JSOSRWHandler *pJVar1;
  JSOSSignalHandler *pJVar2;
  list_head *plVar3;
  JSOSTimer *pJVar4;
  JSOSRWHandler *rh;
  JSOSSignalHandler *sh;
  JSOSTimer *th_00;
  list_head *prev;
  JSOSRWHandler *__ptr;
  JSOSTimer *th;
  list_head *next;
  
  __ptr = (JSOSRWHandler *)JS_GetRuntimeOpaque(rt);
  rh = (JSOSRWHandler *)(__ptr->link).next;
  while (rh != __ptr) {
    pJVar1 = (JSOSRWHandler *)(rh->link).next;
    free_rw_handler(rt,rh);
    rh = pJVar1;
  }
  sh = (JSOSSignalHandler *)__ptr->rw_func[0].u.ptr;
  while (sh != (JSOSSignalHandler *)&__ptr->fd) {
    pJVar2 = (JSOSSignalHandler *)(sh->link).next;
    free_sh(rt,sh);
    sh = pJVar2;
  }
  pJVar4 = (JSOSTimer *)__ptr->rw_func[1].u.ptr;
  while (th_00 = pJVar4, th_00 != (JSOSTimer *)&__ptr->rw_func[0].tag) {
    plVar3 = (th_00->link).prev;
    pJVar4 = (JSOSTimer *)(th_00->link).next;
    if (plVar3 != (list_head *)0x0) {
      plVar3->next = (list_head *)pJVar4;
      (pJVar4->link).prev = plVar3;
      (th_00->link).prev = (list_head *)0x0;
      (th_00->link).next = (list_head *)0x0;
    }
    if (th_00->has_object == 0) {
      free_timer(rt,th_00);
    }
  }
  js_free_message_pipe(*(JSWorkerMessagePipe **)&__ptr[1].fd);
  js_free_message_pipe((JSWorkerMessagePipe *)__ptr[1].rw_func[0].u.ptr);
  free(__ptr);
  JS_SetRuntimeOpaque(rt,(void *)0x0);
  return;
}

Assistant:

void js_std_free_handlers(JSRuntime *rt)
{
    JSThreadState *ts = JS_GetRuntimeOpaque(rt);
    struct list_head *el, *el1;

    list_for_each_safe(el, el1, &ts->os_rw_handlers) {
        JSOSRWHandler *rh = list_entry(el, JSOSRWHandler, link);
        free_rw_handler(rt, rh);
    }

    list_for_each_safe(el, el1, &ts->os_signal_handlers) {
        JSOSSignalHandler *sh = list_entry(el, JSOSSignalHandler, link);
        free_sh(rt, sh);
    }
    
    list_for_each_safe(el, el1, &ts->os_timers) {
        JSOSTimer *th = list_entry(el, JSOSTimer, link);
        unlink_timer(rt, th);
        if (!th->has_object)
            free_timer(rt, th);
    }

#ifdef USE_WORKER
    /* XXX: free port_list ? */
    js_free_message_pipe(ts->recv_pipe);
    js_free_message_pipe(ts->send_pipe);
#endif

    free(ts);
    JS_SetRuntimeOpaque(rt, NULL); /* fail safe */
}